

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo,int eDistinctType)

{
  Vdbe *p;
  Expr *pEVar1;
  ExprList *pList;
  int iVar2;
  int iVar3;
  CollSeq *zP4;
  AggInfo_func *pAVar4;
  int *piVar5;
  int nReg;
  int iVar6;
  ExprList_item *pEVar7;
  int local_54;
  int local_50;
  
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  pAVar4 = pAggInfo->aFunc;
  local_54 = 0;
  for (iVar3 = 0; iVar3 < pAggInfo->nFunc; iVar3 = iVar3 + 1) {
    pEVar1 = pAVar4->pFExpr;
    pList = (pEVar1->x).pList;
    local_50 = 0;
    if ((pEVar1->flags & 0x1000000) == 0) {
      iVar6 = 0;
    }
    else {
      pEVar1 = ((pEVar1->y).pWin)->pFilter;
      if (((pAggInfo->nAccumulator != 0) && (regAcc != 0)) &&
         ((pAVar4->pFunc->funcFlags & 0x20) != 0)) {
        if (local_54 == 0) {
          local_54 = pParse->nMem + 1;
          pParse->nMem = local_54;
        }
        sqlite3VdbeAddOp2(p,0x50,regAcc,local_54);
      }
      iVar6 = pParse->nLabel + -1;
      pParse->nLabel = iVar6;
      sqlite3ExprIfFalse(pParse,pEVar1,iVar6,0x10);
    }
    if (pList == (ExprList *)0x0) {
      nReg = 0;
    }
    else {
      nReg = pList->nExpr;
      local_50 = sqlite3GetTempRange(pParse,nReg);
      sqlite3ExprCodeExprList(pParse,pList,local_50,0,'\x01');
      iVar2 = pAVar4->iDistinct;
      if (-1 < iVar2) {
        if (iVar6 == 0) {
          iVar6 = pParse->nLabel + -1;
          pParse->nLabel = iVar6;
        }
        iVar2 = codeDistinct(pParse,eDistinctType,iVar2,iVar6,pList,local_50);
        pAVar4->iDistinct = iVar2;
      }
    }
    if ((pAVar4->pFunc->funcFlags & 0x20) != 0) {
      pEVar7 = pList->a;
      zP4 = (CollSeq *)0x0;
      for (iVar2 = 0; (zP4 == (CollSeq *)0x0 && (iVar2 < nReg)); iVar2 = iVar2 + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEVar7->pExpr);
        pEVar7 = pEVar7 + 1;
      }
      if (zP4 == (CollSeq *)0x0) {
        zP4 = pParse->db->pDfltColl;
      }
      if (local_54 == 0) {
        if (pAggInfo->nAccumulator == 0) {
          local_54 = 0;
        }
        else {
          local_54 = pParse->nMem + 1;
          pParse->nMem = local_54;
        }
      }
      sqlite3VdbeAddOp4(p,0x55,local_54,0,0,(char *)zP4,-2);
    }
    sqlite3VdbeAddOp3(p,0xa2,0,local_50,pAVar4->iMem);
    sqlite3VdbeAppendP4(p,pAVar4->pFunc,-7);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)nReg & 0xff;
    }
    sqlite3ReleaseTempRange(pParse,local_50,nReg);
    if (iVar6 != 0) {
      sqlite3VdbeResolveLabel(p,iVar6);
    }
    pAVar4 = pAVar4 + 1;
  }
  if (local_54 == 0) {
    iVar3 = 0;
    if ((regAcc == 0) || (local_54 = regAcc, iVar3 = 0, pAggInfo->nAccumulator == 0))
    goto LAB_00171c27;
  }
  iVar3 = sqlite3VdbeAddOp1(p,0xf,local_54);
LAB_00171c27:
  piVar5 = &pAggInfo->aCol->iMem;
  for (iVar6 = 0; iVar6 < pAggInfo->nAccumulator; iVar6 = iVar6 + 1) {
    sqlite3ExprCode(pParse,*(Expr **)(piVar5 + -3),*piVar5);
    piVar5 = piVar5 + 8;
  }
  pAggInfo->directMode = '\0';
  if (iVar3 == 0) {
    return;
  }
  sqlite3VdbeJumpHereOrPopInst(p,iVar3);
  return;
}

Assistant:

static void updateAccumulator(
  Parse *pParse,
  int regAcc,
  AggInfo *pAggInfo,
  int eDistinctType
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    assert( !IsWindowFunc(pF->pFExpr) );
    pList = pF->pFExpr->x.pList;
    if( ExprHasProperty(pF->pFExpr, EP_WinFunc) ){
      Expr *pFilter = pF->pFExpr->y.pWin->pFilter;
      if( pAggInfo->nAccumulator
       && (pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)
       && regAcc
      ){
        /* If regAcc==0, there there exists some min() or max() function
        ** without a FILTER clause that will ensure the magnet registers
        ** are populated. */
        if( regHit==0 ) regHit = ++pParse->nMem;
        /* If this is the first row of the group (regAcc contains 0), clear the
        ** "magnet" register regHit so that the accumulator registers
        ** are populated if the FILTER clause jumps over the the
        ** invocation of min() or max() altogether. Or, if this is not
        ** the first row (regAcc contains 1), set the magnet register so that
        ** the accumulators are not populated unless the min()/max() is invoked
        ** and indicates that they should be.  */
        sqlite3VdbeAddOp2(v, OP_Copy, regAcc, regHit);
      }
      addrNext = sqlite3VdbeMakeLabel(pParse);
      sqlite3ExprIfFalse(pParse, pFilter, addrNext, SQLITE_JUMPIFNULL);
    }
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 && pList ){
      if( addrNext==0 ){
        addrNext = sqlite3VdbeMakeLabel(pParse);
      }
      pF->iDistinct = codeDistinct(pParse, eDistinctType,
          pF->iDistinct, addrNext, pList, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pCExpr, pC->iMem);
  }

  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHereOrPopInst(v, addrHitTest);
  }
}